

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

RtAudioErrorType __thiscall RtApiAlsa::stopStream(RtApiAlsa *this)

{
  StreamMutex *__mutex;
  StreamState SVar1;
  undefined8 *puVar2;
  int iVar3;
  StreamMode SVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  RtAudioErrorType RVar8;
  RtAudioErrorType type;
  char *pcVar9;
  ostringstream *poVar10;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  SVar1 = (this->super_RtApi).stream_.state;
  if ((uint)(SVar1 + ~STREAM_STOPPED) < 2) {
    (this->super_RtApi).stream_.state = STREAM_STOPPED;
    __mutex = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    puVar2 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
    SVar4 = (this->super_RtApi).stream_.mode;
    if ((SVar4 & ~DUPLEX) == OUTPUT) {
      if (*(char *)(puVar2 + 2) == '\x01') {
        iVar3 = snd_pcm_drop();
      }
      else {
        iVar3 = snd_pcm_drain(*puVar2);
      }
      if (-1 < iVar3) {
        SVar4 = (this->super_RtApi).stream_.mode;
        goto LAB_0010e609;
      }
      pcVar9 = "RtApiAlsa::stopStream: error draining output pcm device, ";
      lVar7 = 0x39;
    }
    else {
LAB_0010e609:
      if (((1 < (uint)(SVar4 + ~OUTPUT)) || (*(char *)(puVar2 + 2) != '\0')) ||
         (iVar3 = snd_pcm_drop(puVar2[1]), -1 < iVar3)) {
        *(undefined1 *)(puVar2 + 9) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return RTAUDIO_NO_ERROR;
      }
      pcVar9 = "RtApiAlsa::stopStream: error stopping input pcm device, ";
      lVar7 = 0x38;
    }
    poVar10 = &(this->super_RtApi).errorStream_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar9,lVar7);
    pcVar9 = (char *)snd_strerror(iVar3);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar9,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,".",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    *(undefined1 *)(puVar2 + 9) = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    RVar8 = RTAUDIO_SYSTEM_ERROR;
    type = RTAUDIO_SYSTEM_ERROR;
    goto LAB_0010e5f1;
  }
  if (SVar1 == STREAM_CLOSED) {
    pcVar9 = (char *)(this->super_RtApi).errorText_._M_string_length;
    pcVar6 = "RtApiAlsa::stopStream(): the stream is closed!";
LAB_0010e5dd:
    std::__cxx11::string::_M_replace((ulong)&(this->super_RtApi).errorText_,0,pcVar9,(ulong)pcVar6);
  }
  else if (SVar1 == STREAM_STOPPED) {
    pcVar9 = (char *)(this->super_RtApi).errorText_._M_string_length;
    pcVar6 = "RtApiAlsa::stopStream(): the stream is already stopped!";
    goto LAB_0010e5dd;
  }
  RVar8 = RTAUDIO_WARNING;
  type = RTAUDIO_WARNING;
LAB_0010e5f1:
  RtApi::error(&this->super_RtApi,type);
  return RVar8;
}

Assistant:

RtAudioErrorType RtApiAlsa :: stopStream()
{
  if ( stream_.state != STREAM_RUNNING && stream_.state != STREAM_STOPPING ) {
    if ( stream_.state == STREAM_STOPPED )
      errorText_ = "RtApiAlsa::stopStream(): the stream is already stopped!";
    else if ( stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::stopStream(): the stream is closed!";
    return error( RTAUDIO_WARNING );
  }

  stream_.state = STREAM_STOPPED;
  MUTEX_LOCK( &stream_.mutex );

  int result = 0;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    if ( apiInfo->synchronized ) 
      result = snd_pcm_drop( handle[0] );
    else
      result = snd_pcm_drain( handle[0] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::stopStream: error draining output pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop( handle[1] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::stopStream: error stopping input pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

 unlock:
  apiInfo->runnable = false; // fixes high CPU usage when stopped
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}